

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O0

void generate_a_record(Person *person)

{
  Person_PhoneNumber *this;
  PhoneNumber *phone_number;
  string local_98 [8];
  string number;
  allocator local_71;
  string local_70 [8];
  string email;
  allocator local_39;
  string local_38 [8];
  string name;
  int id;
  Person *person_local;
  
  Messages::Person::set_id(person,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"John Doe",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  Messages::Person::set_name(person,(string *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"JohnDoe@gmail.com",&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  Messages::Person::set_email(person,(string *)local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"032-9898-8765",(allocator *)((long)&phone_number + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&phone_number + 7));
  this = Messages::Person::add_phones(person);
  Messages::Person_PhoneNumber::set_number(this,(string *)local_98);
  Messages::Person_PhoneNumber::set_type(this,Person_PhoneType_MOBILE);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void generate_a_record(Messages::Person* person) {
  int id = 0;
  person->set_id(id);
  string name = "John Doe";
  person->set_name(name);
  string email = "JohnDoe@gmail.com";
  person->set_email(email);
  string number = "032-9898-8765";
  Messages::Person::PhoneNumber* phone_number = person->add_phones();
  phone_number->set_number(number);
  phone_number->set_type(Messages::Person::MOBILE);
}